

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcsutil.c
# Opt level: O0

int ffxypx(double xpos,double ypos,double xref,double yref,double xrefpix,double yrefpix,double xinc
          ,double yinc,double rot,char *type,double *xpix,double *ypix,int *status)

{
  char *pcVar1;
  int *in_RCX;
  double *in_RDX;
  double *in_RSI;
  char *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  undefined4 in_XMM4_Da;
  undefined4 in_XMM4_Db;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  double in_XMM7_Qa;
  double in_stack_00000008;
  char *cptr;
  double deps;
  double sin0;
  double cos0;
  double cosr;
  double sinr;
  double geo3;
  double geo2;
  double geo1;
  double m;
  double l;
  double sint;
  double dd;
  double da;
  double dt;
  double sins;
  double coss;
  double dec;
  double ra;
  double dec0;
  double ra0;
  double r;
  double dz;
  double dy;
  double dx;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_c0;
  double local_70;
  double local_10;
  int local_4;
  
  if (*in_RDI == '-') {
    pcVar1 = in_RDI + 1;
    local_10 = in_XMM0_Qa;
    if (180.0 < in_XMM0_Qa - in_XMM2_Qa) {
      local_10 = in_XMM0_Qa - 360.0;
    }
    if (in_XMM0_Qa - in_XMM2_Qa < -180.0) {
      local_10 = local_10 + 360.0;
    }
    dVar2 = cos(in_stack_00000008 * 0.01745329252);
    dVar3 = sin(in_stack_00000008 * 0.01745329252);
    if (((in_XMM6_Qa == 0.0) && (!NAN(in_XMM6_Qa))) || ((in_XMM7_Qa == 0.0 && (!NAN(in_XMM7_Qa)))))
    {
      *in_RSI = 0.0;
      *in_RDX = 0.0;
      *in_RCX = 0x1f6;
      local_4 = 0x1f6;
    }
    else {
      *in_RSI = ((local_10 - in_XMM2_Qa) * dVar2 + (in_XMM1_Qa - in_XMM3_Qa) * dVar3) / in_XMM6_Qa +
                (double)CONCAT44(in_XMM4_Db,in_XMM4_Da);
      *in_RDX = ((in_XMM1_Qa - in_XMM3_Qa) * dVar2 + -((local_10 - in_XMM2_Qa) * dVar3)) /
                in_XMM7_Qa + in_XMM5_Qa;
      if (*pcVar1 == 'C') {
        if ((in_RDI[2] == 'A') && (in_RDI[3] == 'R')) {
          local_4 = *in_RCX;
        }
        else {
          *in_RCX = 0x1f8;
          local_4 = 0x1f8;
        }
      }
      else {
        dVar4 = in_XMM2_Qa * 0.01745329252;
        dVar5 = in_XMM3_Qa * 0.01745329252;
        local_10 = local_10 * 0.01745329252;
        local_e8 = in_XMM1_Qa * 0.01745329252;
        dVar6 = cos(local_e8);
        dVar7 = sin(local_e8);
        dVar8 = cos(dVar5);
        dVar9 = sin(dVar5);
        local_e0 = sin(local_10 - dVar4);
        local_e0 = local_e0 * dVar6;
        dVar10 = cos(local_10 - dVar4);
        dVar10 = dVar7 * dVar9 + dVar6 * dVar8 * dVar10;
        if (*pcVar1 == 'T') {
          if ((in_RDI[2] != 'A') || (in_RDI[3] != 'N')) {
            *in_RCX = 0x1f8;
            return 0x1f8;
          }
          if (dVar10 <= 0.0) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          if (0.001 <= dVar8) {
            local_e8 = (dVar7 / dVar10 - dVar9) / dVar8;
          }
          else {
            dVar5 = cos(local_10 - dVar4);
            dVar5 = (dVar6 * dVar5) / (dVar7 * dVar9);
            local_e8 = (dVar8 * (dVar5 * dVar5 + 1.0) + -dVar5) / dVar9;
          }
          dVar5 = sin(dVar4);
          if (0.3 <= ABS(dVar5)) {
            dVar5 = cos(local_10);
            dVar7 = cos(dVar4);
            dVar11 = cos(dVar4);
            dVar4 = sin(dVar4);
            local_e0 = (local_e8 * dVar11 * dVar9 + -dVar8 * dVar7 + (dVar6 * dVar5) / dVar10) /
                       -dVar4;
          }
          else {
            dVar5 = sin(local_10);
            dVar7 = sin(dVar4);
            dVar11 = sin(dVar4);
            local_e0 = cos(dVar4);
            local_e0 = (local_e8 * dVar11 * dVar9 + -dVar8 * dVar7 + (dVar6 * dVar5) / dVar10) /
                       local_e0;
          }
        }
        else if (*pcVar1 == 'S') {
          if ((in_RDI[2] == 'I') && (in_RDI[3] == 'N')) {
            if (dVar10 < 0.0) {
              *in_RCX = 0x1f5;
              return 0x1f5;
            }
            dVar8 = cos(dVar5);
            dVar5 = sin(dVar5);
            dVar4 = cos(local_10 - dVar4);
            local_e8 = dVar7 * dVar8 + -(dVar6 * dVar5 * dVar4);
          }
          else {
            if ((in_RDI[2] != 'T') || (in_RDI[3] != 'G')) {
              *in_RCX = 0x1f8;
              return 0x1f8;
            }
            if (1.5707963267948974 < ABS(local_e8)) {
              *in_RCX = 0x1f5;
              return 0x1f5;
            }
            dVar8 = sin(dVar5);
            dVar9 = cos(dVar5);
            dVar10 = cos(local_10 - dVar4);
            local_e8 = dVar6 * dVar9 * dVar10 + dVar7 * dVar8 + 1.0;
            if (ABS(local_e8) < 1e-05) {
              *in_RCX = 0x1f5;
              return 0x1f5;
            }
            local_e8 = 2.0 / local_e8;
            local_e0 = local_e0 * local_e8;
            dVar8 = cos(dVar5);
            dVar5 = sin(dVar5);
            dVar4 = cos(local_10 - dVar4);
            local_e8 = local_e8 * (dVar7 * dVar8 + -(dVar6 * dVar5 * dVar4));
          }
        }
        else if (*pcVar1 == 'A') {
          if ((in_RDI[2] == 'R') && (in_RDI[3] == 'C')) {
            dVar8 = sin(dVar5);
            dVar9 = cos(dVar5);
            dVar10 = cos(local_10 - dVar4);
            local_e8 = dVar7 * dVar8 + dVar6 * dVar9 * dVar10;
            if (local_e8 < -1.0) {
              local_e8 = -1.0;
            }
            if (1.0 < local_e8) {
              local_e8 = 1.0;
            }
            local_e8 = acos(local_e8);
            if ((local_e8 != 0.0) || (NAN(local_e8))) {
              dVar8 = sin(local_e8);
              local_e8 = local_e8 / dVar8;
            }
            else {
              local_e8 = 1.0;
            }
            local_e0 = local_e0 * local_e8;
            dVar8 = cos(dVar5);
            dVar5 = sin(dVar5);
            dVar4 = cos(local_10 - dVar4);
            local_e8 = (dVar7 * dVar8 + -(dVar6 * dVar5 * dVar4)) * local_e8;
          }
          else {
            if ((in_RDI[2] != 'I') || (in_RDI[3] != 'T')) {
              *in_RCX = 0x1f8;
              return 0x1f8;
            }
            dVar4 = (local_10 - dVar4) / 2.0;
            if (1.5707963267948974 < ABS(dVar4)) {
              *in_RCX = 0x1f5;
              return 0x1f5;
            }
            local_c0 = in_XMM7_Qa * dVar2 + in_XMM6_Qa * dVar3;
            if ((local_c0 == 0.0) && (!NAN(local_c0))) {
              local_c0 = 1.0;
            }
            local_c0 = local_c0 * 0.01745329252;
            dVar5 = in_XMM3_Qa * 0.01745329252;
            dVar6 = sin(dVar5 + local_c0);
            dVar7 = cos(dVar5 + local_c0);
            dVar7 = sqrt((dVar7 + 1.0) / 2.0);
            dVar8 = sin(dVar5);
            dVar9 = cos(dVar5);
            dVar9 = sqrt((dVar9 + 1.0) / 2.0);
            local_70 = dVar6 / dVar7 - dVar8 / dVar9;
            if ((local_70 == 0.0) && (!NAN(local_70))) {
              local_70 = 1.0;
            }
            dVar6 = local_c0 / local_70;
            local_c0 = in_XMM6_Qa * dVar2 + -(in_XMM7_Qa * dVar3);
            if ((local_c0 == 0.0) && (!NAN(local_c0))) {
              local_c0 = 1.0;
            }
            local_c0 = local_c0 * 0.01745329252;
            dVar7 = cos(dVar5);
            local_70 = sin(local_c0 / 2.0);
            local_70 = dVar7 * 2.0 * local_70;
            if ((local_70 == 0.0) && (!NAN(local_70))) {
              local_70 = 1.0;
            }
            dVar7 = cos(dVar5);
            dVar8 = cos(local_c0 / 2.0);
            dVar7 = sqrt((dVar7 * dVar8 + 1.0) / 2.0);
            dVar8 = sin(dVar5);
            dVar5 = cos(dVar5);
            dVar5 = sqrt((dVar5 + 1.0) / 2.0);
            dVar9 = cos(local_e8);
            dVar10 = cos(dVar4);
            dVar9 = sqrt((dVar9 * dVar10 + 1.0) / 2.0);
            if (ABS(dVar9) < 1e-05) {
              *in_RCX = 0x1f7;
              return 0x1f7;
            }
            dVar10 = cos(local_e8);
            dVar4 = sin(dVar4);
            local_e0 = (((local_c0 * dVar7) / local_70) * 2.0 * dVar10 * dVar4) / dVar9;
            dVar4 = sin(local_e8);
            local_e8 = (dVar6 * dVar4) / dVar9 - (dVar6 * dVar8) / dVar5;
          }
        }
        else if (*pcVar1 == 'N') {
          if ((in_RDI[2] != 'C') || (in_RDI[3] != 'P')) {
            *in_RCX = 0x1f8;
            return 0x1f8;
          }
          if ((dVar5 == 0.0) && (!NAN(dVar5))) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          dVar7 = cos(dVar5);
          dVar4 = cos(local_10 - dVar4);
          local_e8 = sin(dVar5);
          local_e8 = (-dVar6 * dVar4 + dVar7) / local_e8;
        }
        else if (*pcVar1 == 'G') {
          if ((in_RDI[2] != 'L') || (in_RDI[3] != 'S')) {
            *in_RCX = 0x1f8;
            return 0x1f8;
          }
          if (1.5707963267948974 < ABS(local_e8)) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          if (1.5707963267948974 < ABS(dVar5)) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          local_e8 = local_e8 - dVar5;
          local_e0 = (local_10 - dVar4) * dVar6;
        }
        else {
          if (*pcVar1 != 'M') {
            *in_RCX = 0x1f8;
            return 0x1f8;
          }
          if ((in_RDI[2] != 'E') || (in_RDI[3] != 'R')) {
            *in_RCX = 0x1f8;
            return 0x1f8;
          }
          local_c0 = in_XMM7_Qa * dVar2 + in_XMM6_Qa * dVar3;
          if ((local_c0 == 0.0) && (!NAN(local_c0))) {
            local_c0 = 1.0;
          }
          dVar5 = (in_XMM3_Qa / 2.0 + 45.0) * 0.01745329252;
          dVar6 = tan(dVar5);
          dVar6 = log(dVar6);
          dVar5 = tan((local_c0 / 2.0) * 0.01745329252 + dVar5);
          dVar5 = log(dVar5);
          dVar5 = (local_c0 * 0.01745329252) / (dVar5 - dVar6);
          local_f0 = cos(in_XMM3_Qa * 0.01745329252);
          if (local_f0 <= 0.0) {
            local_f0 = 1.0;
          }
          local_e0 = local_f0 * (local_10 - dVar4);
          dVar4 = tan(local_e8 / 2.0 + 0.7853981633974487);
          if (dVar4 < 1e-05) {
            *in_RCX = 0x1f6;
            return 0x1f6;
          }
          dVar4 = log(dVar4);
          local_e8 = dVar5 * dVar4 + -(dVar5 * dVar6);
        }
        *in_RSI = ((local_e0 / 0.01745329252) * dVar2 + (local_e8 / 0.01745329252) * dVar3) /
                  in_XMM6_Qa + (double)CONCAT44(in_XMM4_Db,in_XMM4_Da);
        *in_RDX = ((local_e8 / 0.01745329252) * dVar2 + -((local_e0 / 0.01745329252) * dVar3)) /
                  in_XMM7_Qa + in_XMM5_Qa;
        local_4 = *in_RCX;
      }
    }
  }
  else {
    *in_RCX = 0x1f8;
    local_4 = 0x1f8;
  }
  return local_4;
}

Assistant:

int ffxypx(double xpos, double ypos, double xref, double yref, 
      double xrefpix, double yrefpix, double xinc, double yinc, double rot,
      char *type, double *xpix, double *ypix, int *status)

/* This routine is based on the classic AIPS WCS routine. 

   It converts from RA,Dec to pixel location to for 9 projective geometries:
   "-CAR", "-SIN", "-TAN", "-ARC", "-NCP", "-GLS", "-MER", "-AIT" and "-STG".
*/
/*-----------------------------------------------------------------------*/
/* routine to determine accurate pixel coordinates for an RA and Dec     */
/* returns 0 if successful otherwise:                                    */
/* 501 = angle too large for projection;                                 */
/* 502 = bad values                                                      */
/* does: -SIN, -TAN, -ARC, -NCP, -GLS, -MER, -AIT projections            */
/* anything else is linear                                               */
/* Input:                                                                */
/*   d   xpos    x (RA) coordinate (deg)                                 */
/*   d   ypos    y (dec) coordinate (deg)                                */
/*   d   xref    x reference coordinate value (deg)                      */
/*   d   yref    y reference coordinate value (deg)                      */
/*   f   xrefpix x reference pixel                                       */
/*   f   yrefpix y reference pixel                                       */
/*   f   xinc    x coordinate increment (deg)                            */
/*   f   yinc    y coordinate increment (deg)                            */
/*   f   rot     rotation (deg)  (from N through E)                      */
/*   c  *type    projection type code e.g. "-SIN";                       */
/* Output:                                                               */
/*   f  *xpix    x pixel number  (RA or long without rotation)           */
/*   f  *ypiy    y pixel number  (dec or lat without rotation)           */
/*-----------------------------------------------------------------------*/
 {
  double dx, dy, dz, r, ra0, dec0, ra, dec, coss, sins, dt, da, dd, sint;
  double l, m, geo1, geo2, geo3, sinr, cosr, cos0, sin0;
  double deps=1.0e-5;
  char *cptr;

  if (*type != '-') {  /* unrecognized projection code */
     return(*status = 504);
  }

  cptr = type + 1;

  dt = (xpos - xref);
  if (dt >  180) xpos -= 360;
  if (dt < -180) xpos += 360;
  /* NOTE: changing input argument xpos is OK (call-by-value in C!) */

  /* default values - linear */
  dx = xpos - xref;
  dy = ypos - yref;

  /*  Correct for rotation */
  r = rot * D2R;
  cosr = cos (r);
  sinr = sin (r);
  dz = dx*cosr + dy*sinr;
  dy = dy*cosr - dx*sinr;
  dx = dz;

  /*     check axis increments - bail out if either 0 */
  if ((xinc==0.0) || (yinc==0.0)) {*xpix=0.0; *ypix=0.0;
    return(*status = 502);}

  /*     convert to pixels  */
  *xpix = dx / xinc + xrefpix;
  *ypix = dy / yinc + yrefpix;

  if (*cptr == 'C') { /* linear -CAR */
      if (*(cptr + 1) != 'A' ||  *(cptr + 2) != 'R') {
         return(*status = 504);
      }

      return(*status);  /* done if linear */
  }

  /* Non linear position */
  ra0 = xref * D2R;
  dec0 = yref * D2R;
  ra = xpos * D2R;
  dec = ypos * D2R;

  /* compute direction cosine */
  coss = cos (dec);
  sins = sin (dec);
  cos0 = cos (dec0);
  sin0 = sin (dec0);
  l = sin(ra-ra0) * coss;
  sint = sins * sin0 + coss * cos0 * cos(ra-ra0);

    /* process by case  */
    if (*cptr == 'T') {  /* -TAN tan */
         if (*(cptr + 1) != 'A' ||  *(cptr + 2) != 'N') {
           return(*status = 504);
         }

         if (sint<=0.0)
	   return(*status = 501);
         if( cos0<0.001 ) {
            /* Do a first order expansion around pole */
            m = (coss * cos(ra-ra0)) / (sins * sin0);
            m = (-m + cos0 * (1.0 + m*m)) / sin0;
         } else {
            m = ( sins/sint - sin0 ) / cos0;
         }
	 if( fabs(sin(ra0)) < 0.3 ) {
	    l  = coss*sin(ra)/sint - cos0*sin(ra0) + m*sin(ra0)*sin0;
	    l /= cos(ra0);
	 } else {
	    l  = coss*cos(ra)/sint - cos0*cos(ra0) + m*cos(ra0)*sin0;
	    l /= -sin(ra0);
	 }

    } else if (*cptr == 'S') {

      if (*(cptr + 1) == 'I' &&  *(cptr + 2) == 'N') { /* -SIN */
         if (sint<0.0)
	   return(*status = 501);
         m = sins * cos(dec0) - coss * sin(dec0) * cos(ra-ra0);

      } else if (*(cptr + 1) == 'T' &&  *(cptr + 2) == 'G') {  /* -STG Sterographic*/
         da = ra - ra0;
         if (fabs(dec)>TWOPI/4.0)
	   return(*status = 501);
         dd = 1.0 + sins * sin(dec0) + coss * cos(dec0) * cos(da);
         if (fabs(dd)<deps)
	   return(*status = 501);
         dd = 2.0 / dd;
         l = l * dd;
         m = dd * (sins * cos(dec0) - coss * sin(dec0) * cos(da));

        } else  {
          return(*status = 504);
        }
 
    } else if (*cptr == 'A') {

      if (*(cptr + 1) == 'R' &&  *(cptr + 2) == 'C') { /* ARC */
         m = sins * sin(dec0) + coss * cos(dec0) * cos(ra-ra0);
         if (m<-1.0) m = -1.0;
         if (m>1.0) m = 1.0;
         m = acos (m);
         if (m!=0) 
            m = m / sin(m);
         else
            m = 1.0;
         l = l * m;
         m = (sins * cos(dec0) - coss * sin(dec0) * cos(ra-ra0)) * m;

      } else if (*(cptr + 1) == 'I' &&  *(cptr + 2) == 'T') {  /* -AIT Aitoff */
         da = (ra - ra0) / 2.0;
         if (fabs(da)>TWOPI/4.0)
	     return(*status = 501);
         dt = yinc*cosr + xinc*sinr;
         if (dt==0.0) dt = 1.0;
         dt = dt * D2R;
         dy = yref * D2R;
         dx = sin(dy+dt)/sqrt((1.0+cos(dy+dt))/2.0) -
             sin(dy)/sqrt((1.0+cos(dy))/2.0);
         if (dx==0.0) dx = 1.0;
         geo2 = dt / dx;
         dt = xinc*cosr - yinc* sinr;
         if (dt==0.0) dt = 1.0;
         dt = dt * D2R;
         dx = 2.0 * cos(dy) * sin(dt/2.0);
         if (dx==0.0) dx = 1.0;
         geo1 = dt * sqrt((1.0+cos(dy)*cos(dt/2.0))/2.0) / dx;
         geo3 = geo2 * sin(dy) / sqrt((1.0+cos(dy))/2.0);
         dt = sqrt ((1.0 + cos(dec) * cos(da))/2.0);
         if (fabs(dt)<deps)
	     return(*status = 503);
         l = 2.0 * geo1 * cos(dec) * sin(da) / dt;
         m = geo2 * sin(dec) / dt - geo3;

        } else  {
          return(*status = 504);
        }
 
    } else if (*cptr == 'N') { /* -NCP North celestial pole*/
         if (*(cptr + 1) != 'C' ||  *(cptr + 2) != 'P') {
             return(*status = 504);
         }

         if (dec0==0.0) 
	     return(*status = 501);  /* can't stand the equator */
         else
	   m = (cos(dec0) - coss * cos(ra-ra0)) / sin(dec0);

    } else if (*cptr == 'G') {   /* -GLS global sinusoid */
         if (*(cptr + 1) != 'L' ||  *(cptr + 2) != 'S') {
             return(*status = 504);
         }

         dt = ra - ra0;
         if (fabs(dec)>TWOPI/4.0)
	   return(*status = 501);
         if (fabs(dec0)>TWOPI/4.0)
	   return(*status = 501);
         m = dec - dec0;
         l = dt * coss;

    } else if (*cptr == 'M') {  /* -MER mercator*/
         if (*(cptr + 1) != 'E' ||  *(cptr + 2) != 'R') {
             return(*status = 504);
         }

         dt = yinc * cosr + xinc * sinr;
         if (dt==0.0) dt = 1.0;
         dy = (yref/2.0 + 45.0) * D2R;
         dx = dy + dt / 2.0 * D2R;
         dy = log (tan (dy));
         dx = log (tan (dx));
         geo2 = dt * D2R / (dx - dy);
         geo3 = geo2 * dy;
         geo1 = cos (yref*D2R);
         if (geo1<=0.0) geo1 = 1.0;
         dt = ra - ra0;
         l = geo1 * dt;
         dt = dec / 2.0 + TWOPI / 8.0;
         dt = tan (dt);
         if (dt<deps)
	   return(*status = 502);
         m = geo2 * log (dt) - geo3;

    } else  {
      return(*status = 504);
    }

    /*   convert to degrees  */
    dx = l / D2R;
    dy = m / D2R;

    /*  Correct for rotation */
    dz = dx*cosr + dy*sinr;
    dy = dy*cosr - dx*sinr;
    dx = dz;

    /*     convert to pixels  */
    *xpix = dx / xinc + xrefpix;
    *ypix = dy / yinc + yrefpix;
    return(*status);
}